

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void MutableS2ShapeIndex::ClipVAxis
               (ClippedEdge *edge,R1Interval *middle,
               vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               *child_edges,EdgeAllocator *alloc)

{
  vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  *pvVar1;
  EdgeAllocator *this;
  R1Interval *pRVar2;
  double dVar3;
  double dVar4;
  ClippedEdge *local_38;
  ClippedEdge *local_30;
  EdgeAllocator *local_28;
  EdgeAllocator *alloc_local;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *child_edges_local;
  R1Interval *middle_local;
  ClippedEdge *edge_local;
  
  local_28 = alloc;
  alloc_local = (EdgeAllocator *)child_edges;
  child_edges_local =
       (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        *)middle;
  middle_local = (R1Interval *)edge;
  pRVar2 = R2Rect::operator[](&edge->bound,1);
  dVar3 = R1Interval::hi(pRVar2);
  dVar4 = R1Interval::lo((R1Interval *)child_edges_local);
  if (dVar4 < dVar3) {
    pRVar2 = R2Rect::operator[]((R2Rect *)((middle_local->bounds_).c_ + 1),1);
    dVar3 = R1Interval::lo(pRVar2);
    dVar4 = R1Interval::hi((R1Interval *)child_edges_local);
    pRVar2 = middle_local;
    this = alloc_local;
    if (dVar3 < dVar4) {
      dVar3 = R1Interval::hi((R1Interval *)child_edges_local);
      local_30 = ClipVBound((ClippedEdge *)pRVar2,1,dVar3,local_28);
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)this,&local_30);
      pRVar2 = middle_local;
      pvVar1 = &alloc_local->clipped_edges_;
      dVar3 = R1Interval::lo((R1Interval *)child_edges_local);
      local_38 = ClipVBound((ClippedEdge *)pRVar2,0,dVar3,local_28);
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)&(pvVar1->
                      super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage,&local_38);
    }
    else {
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)&(alloc_local->clipped_edges_).
                      super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&middle_local
                 );
    }
  }
  else {
    std::
    vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)alloc_local,(value_type *)&middle_local);
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::ClipVAxis(
    const ClippedEdge* edge,
    const R1Interval& middle,
    vector<const ClippedEdge*> child_edges[2],
    EdgeAllocator* alloc) {
  if (edge->bound[1].hi() <= middle.lo()) {
    // Edge is entirely contained in the lower child.
    child_edges[0].push_back(edge);
  } else if (edge->bound[1].lo() >= middle.hi()) {
    // Edge is entirely contained in the upper child.
    child_edges[1].push_back(edge);
  } else {
    // The edge bound spans both children.
    child_edges[0].push_back(ClipVBound(edge, 1, middle.hi(), alloc));
    child_edges[1].push_back(ClipVBound(edge, 0, middle.lo(), alloc));
  }
}